

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.cpp
# Opt level: O0

DHT_action DHT_Request(DHT_action akv)

{
  prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  **this;
  short sVar1;
  short sVar2;
  short sVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  DHT_action DVar6;
  addressInfo server_00;
  addressInfo server_01;
  bool bVar7;
  reference pvVar8;
  ostream *poVar9;
  type *in_R8;
  DHT_action action;
  DHT_action action_00;
  DHT_action DVar10;
  string local_428 [32];
  int local_408;
  short local_404;
  int local_400;
  short local_3fc;
  string local_3f8 [32];
  DHT_action local_3d8;
  DHT_action local_3c8;
  string local_3b8 [32];
  undefined4 local_398;
  short local_394;
  undefined4 local_390;
  short local_38c;
  string local_388 [32];
  DHT_action local_368;
  DHT_action local_358;
  string local_348 [32];
  undefined4 local_328;
  short local_324;
  undefined4 local_320;
  short local_31c;
  string local_318 [36];
  undefined4 local_2f4;
  DHT_action local_2f0;
  undefined8 local_2e0;
  int local_2d8;
  int local_2d0;
  uint local_2cc;
  undefined8 local_2c8;
  int local_2c0;
  int local_2b8;
  short local_2b4;
  undefined1 local_2b0 [8];
  DHT_action neighborServer2;
  undefined1 local_260 [8];
  DHT_action neighborServer1;
  undefined1 local_210 [8];
  DHT_action primaryServer;
  addressInfo neighbor2;
  addressInfo neighbor1;
  addressInfo server;
  array<addressInfo,_3UL> response;
  mutable_buffer local_1c8;
  size_t local_1b8;
  size_t len;
  array<unsigned_char,_18UL> return_tracker_message;
  array<unsigned_char,_4UL> local_184;
  undefined1 local_180 [4];
  array<unsigned_char,_4UL> key_message;
  error_code error;
  undefined1 local_150 [8];
  socket socket;
  string local_d8 [32];
  undefined1 local_b8 [8];
  results_type endpoints;
  resolver resolver;
  io_context io_context;
  addressInfo trackerServerInfo;
  _Type auStack_1c;
  DHT_action akv_local;
  int local_c;
  
  this = &resolver.impl_.executor_.prop_fns_;
  asio::io_context::io_context((io_context *)this);
  asio::ip::
  basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_resolver<asio::io_context>
            ((basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&stack0xffffffffffffff70,(io_context *)this,(type *)0x0);
  ip_tostr_abi_cxx11_((array<unsigned_char,_4UL>)SUB84(local_d8,0));
  std::__cxx11::to_string
            ((__cxx11 *)
             &socket.
              super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_.prop_fns_,3000);
  asio::ip::
  basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve((results_type *)local_b8,
            (basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)&stack0xffffffffffffff70,local_d8,
            (string *)
            &socket.
             super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .impl_.executor_.prop_fns_);
  std::__cxx11::string::~string
            ((string *)
             &socket.
              super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_.prop_fns_);
  std::__cxx11::string::~string((string *)local_d8);
  asio::
  basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_150,(io_context *)&resolver.impl_.executor_.prop_fns_,(type *)0x0);
  asio::
  connect<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>,asio::ip::basic_resolver_results<asio::ip::tcp>>
            ((endpoint *)((long)&error._M_cat + 4),(asio *)local_150,
             (basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_b8,(basic_resolver_results<asio::ip::tcp> *)0x0,in_R8);
  std::error_code::error_code((error_code *)local_180);
  auStack_1c = (_Type)akv.key;
  local_184._M_elems[0] = auStack_1c[0];
  local_184._M_elems[1] = auStack_1c[1];
  local_184._M_elems[2] = auStack_1c[2];
  local_184._M_elems[3] = auStack_1c[3];
  join_0x00000010_0x00000000_ = (mutable_buffer)asio::buffer<unsigned_char,4ul>(&local_184);
  asio::
  write<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1>
            ((basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_150,(mutable_buffers_1 *)(return_tracker_message._M_elems + 10),
             (error_code *)local_180,(type *)0x0);
  local_1c8 = (mutable_buffer)
              asio::buffer<unsigned_char,18ul>((array<unsigned_char,_18UL> *)((long)&len + 6));
  local_1b8 = asio::
              basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::read_some<asio::mutable_buffers_1>
                        ((basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                          *)local_150,(mutable_buffers_1 *)&local_1c8,(error_code *)local_180);
  _server = stack0xfffffffffffffe56;
  pvVar8 = std::array<addressInfo,_3UL>::operator[]((array<addressInfo,_3UL> *)&server,0);
  sVar1 = pvVar8->port;
  uVar4 = *(undefined4 *)(pvVar8->IPAddress)._M_elems;
  server_00.IPAddress._M_elems = (pvVar8->IPAddress)._M_elems[0];
  server_00.port = pvVar8->port;
  pvVar8 = std::array<addressInfo,_3UL>::operator[]((array<addressInfo,_3UL> *)&server,1);
  sVar2 = pvVar8->port;
  uVar5 = *(undefined4 *)(pvVar8->IPAddress)._M_elems;
  server_01.IPAddress._M_elems = (pvVar8->IPAddress)._M_elems[0];
  server_01.port = pvVar8->port;
  pvVar8 = std::array<addressInfo,_3UL>::operator[]((array<addressInfo,_3UL> *)&server,2);
  sVar3 = pvVar8->port;
  primaryServer.value = *(int *)(pvVar8->IPAddress)._M_elems;
  DVar10 = Server_Request(server_00,akv);
  primaryServer.action = DVar10.value;
  register0x00000000 = DVar10._0_8_;
  local_210 = (undefined1  [8])register0x00000000;
  DVar10 = Server_Request(server_01,akv);
  neighborServer1.action = DVar10.value;
  register0x00000000 = DVar10._0_8_;
  local_2b8 = primaryServer.value;
  local_2cc = CONCAT22(local_2cc._2_2_,sVar3);
  local_2d0 = primaryServer.value;
  local_2e0 = akv._0_8_;
  local_2d8 = akv.value;
  local_2c8 = akv._0_8_;
  local_2c0 = akv.value;
  local_2b4 = sVar3;
  local_260 = (undefined1  [8])register0x00000000;
  local_2f0 = Server_Request((addressInfo)
                             ((uint6)(uint)primaryServer.value | (uint6)local_2cc << 0x20),akv);
  neighborServer2.action = local_2f0.value;
  local_2b0 = local_2f0._0_8_;
  bVar7 = DHT_action::operator==((DHT_action *)local_210,(DHT_action *)local_260);
  if (bVar7) {
    bVar7 = DHT_action::operator==((DHT_action *)local_210,(DHT_action *)local_2b0);
    if ((bVar7) && (local_210._4_4_ != -1)) {
      akv_local.key = local_210._0_4_;
      akv_local.value = local_210._4_4_;
      local_c = primaryServer.action;
      goto LAB_0013fee4;
    }
  }
  if (local_210._4_4_ == -1) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\nNO SERVERS ACTIVE IN THE DHT\n");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    akv_local.key = -1;
    akv_local.value = -1;
    local_c = -1;
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cout,"\nSERVER RESPONSES DO NOT MATCH:");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,"primaryServer: ");
    local_328 = uVar4;
    local_324 = sVar1;
    local_320 = uVar4;
    local_31c = sVar1;
    addressInfo_tostr_abi_cxx11_(SUB86(local_318,0));
    poVar9 = std::operator<<(poVar9,local_318);
    poVar9 = std::operator<<(poVar9,"  --  ");
    local_358.value = primaryServer.action;
    local_358.action = local_210._0_4_;
    local_358.key = local_210._4_4_;
    local_368.value = primaryServer.action;
    local_368.action = local_210._0_4_;
    local_368.key = local_210._4_4_;
    DVar10.value = local_210._0_4_;
    DVar10._0_8_ = local_348;
    dht_action_tostr_abi_cxx11_(DVar10);
    poVar9 = std::operator<<(poVar9,local_348);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::~string(local_318);
    poVar9 = std::operator<<((ostream *)&std::cout,"neighborServer1: ");
    local_398 = uVar5;
    local_394 = sVar2;
    local_390 = uVar5;
    local_38c = sVar2;
    addressInfo_tostr_abi_cxx11_(SUB86(local_388,0));
    poVar9 = std::operator<<(poVar9,local_388);
    poVar9 = std::operator<<(poVar9,"  --  ");
    local_3c8.value = neighborServer1.action;
    local_3c8.action = local_260._0_4_;
    local_3c8.key = local_260._4_4_;
    local_3d8.value = neighborServer1.action;
    local_3d8.action = local_260._0_4_;
    local_3d8.key = local_260._4_4_;
    action.value = local_260._0_4_;
    action._0_8_ = local_3b8;
    dht_action_tostr_abi_cxx11_(action);
    poVar9 = std::operator<<(poVar9,local_3b8);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3b8);
    std::__cxx11::string::~string(local_388);
    poVar9 = std::operator<<((ostream *)&std::cout,"neighborServer2: ");
    local_400 = primaryServer.value;
    local_408 = primaryServer.value;
    local_404 = sVar3;
    local_3fc = sVar3;
    addressInfo_tostr_abi_cxx11_(SUB86(local_3f8,0));
    poVar9 = std::operator<<(poVar9,local_3f8);
    poVar9 = std::operator<<(poVar9,"  --  ");
    action_00.value = local_2b0._0_4_;
    action_00._0_8_ = local_428;
    dht_action_tostr_abi_cxx11_(action_00);
    poVar9 = std::operator<<(poVar9,local_428);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string(local_3f8);
    akv_local.key = -1;
    akv_local.value = -1;
    local_c = -1;
  }
LAB_0013fee4:
  local_2f4 = 1;
  asio::
  basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_stream_socket
            ((basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_150);
  asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)local_b8);
  asio::ip::
  basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_resolver((basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)&stack0xffffffffffffff70);
  asio::io_context::~io_context((io_context *)&resolver.impl_.executor_.prop_fns_);
  DVar6.value = local_c;
  DVar6.action = akv_local.key;
  DVar6.key = akv_local.value;
  return DVar6;
}

Assistant:

DHT_action DHT_Request(DHT_action akv) {
	addressInfo trackerServerInfo = { .IPAddress = {127, 0, 0, 1}, .port = 3000 };
	// std::cout << "SERVER: " << addressInfo_tostr(trackerServerInfo) << ", " << dht_action_tostr(akv) << std::endl;
	using asio::ip::tcp;

	asio::io_context io_context;
	tcp::resolver resolver(io_context);
	tcp::resolver::results_type endpoints = resolver.resolve(ip_tostr(trackerServerInfo.IPAddress), std::to_string(trackerServerInfo.port));

	tcp::socket socket(io_context);
	asio::connect(socket, endpoints);

	asio::error_code error;
	std::array<uint8_t, 4> key_message; // we're just sending the key to the tracker
	memcpy(&key_message, &akv.key, sizeof(int));

	asio::write(socket, asio::buffer(key_message), error);
	std::array<uint8_t, 3*sizeof(addressInfo)> return_tracker_message; // we're receiving an array of 3 addressInfo structs
	size_t len = socket.read_some(asio::buffer(return_tracker_message), error);
	std::array<addressInfo, 3> response;
	memcpy(&response, &return_tracker_message, 3*sizeof(addressInfo));
	addressInfo server = response[0];
	addressInfo neighbor1 = response[1];
	addressInfo neighbor2 = response[2];
	
	// NOW THAT WE HAVE THE PORT, CONNECT TO SERVER
	DHT_action primaryServer = Server_Request(server, akv);
	DHT_action neighborServer1 = Server_Request(neighbor1, akv);
	DHT_action neighborServer2 = Server_Request(neighbor2, akv);
	
	if (primaryServer == neighborServer1  && primaryServer == neighborServer2 && primaryServer.key != -1) {
		return primaryServer;
	}
	else if (primaryServer.key == -1) {
		std::cout << "\nNO SERVERS ACTIVE IN THE DHT\n" << std::endl;
		return (DHT_action){.action = -1, .key = -1, .value = -1};
	}
	else {
		std::cout << "\nSERVER RESPONSES DO NOT MATCH:" << std::endl;
		std::cout << "primaryServer: " << addressInfo_tostr(server) << "  --  " << dht_action_tostr(primaryServer) << std::endl;
		std::cout << "neighborServer1: " << addressInfo_tostr(neighbor1) << "  --  " << dht_action_tostr(neighborServer1) << std::endl;
		std::cout << "neighborServer2: " << addressInfo_tostr(neighbor2) << "  --  " << dht_action_tostr(neighborServer2) << std::endl;
		return (DHT_action){.action = -1, .key = -1, .value = -1};
	}
}